

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

int __thiscall DLevelScript::GetActorProperty(DLevelScript *this,int tid,int property)

{
  AActor *pAVar1;
  bool bVar2;
  int iVar3;
  undefined8 in_RAX;
  long lVar4;
  char *str;
  AActor *pAVar5;
  uint uVar6;
  AActor **ppAVar7;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  pAVar5 = (this->activator).field_0.p;
  if ((pAVar5 != (AActor *)0x0) &&
     (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (this->activator).field_0.p = (AActor *)0x0;
    pAVar5 = (AActor *)0x0;
  }
  if (tid != 0) {
    for (pAVar5 = AActor::TIDHash[tid & 0x7f]; (pAVar5 != (AActor *)0x0 && (pAVar5->tid != tid));
        pAVar5 = pAVar5->inext) {
    }
  }
  iVar3 = 0;
  if (pAVar5 == (AActor *)0x0) {
    return 0;
  }
  switch(property) {
  case 0:
    return pAVar5->health;
  case 1:
    ppAVar7 = (AActor **)pAVar5->Speed;
    break;
  case 2:
    iVar3 = (*(pAVar5->super_DThinker).super_DObject._vptr_DObject[0x23])(pAVar5,0,1);
    return iVar3;
  case 3:
    ppAVar7 = (AActor **)pAVar5->Alpha;
    break;
  case 4:
    lVar4 = 0;
    do {
      if (*(uint32 *)((long)LegacyRenderStyles + lVar4) == (pAVar5->RenderStyle).AsDWORD) {
        return *(int *)((long)LegacyRenderStyleIndices + lVar4);
      }
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x38);
    return 1;
  case 5:
    lVar4 = (long)(pAVar5->SeeSound).super_FSoundID.ID;
    goto LAB_004e1089;
  case 6:
    lVar4 = (long)(pAVar5->AttackSound).super_FSoundID.ID;
    goto LAB_004e1089;
  case 7:
    lVar4 = (long)(pAVar5->PainSound).super_FSoundID.ID;
    goto LAB_004e1089;
  case 8:
    lVar4 = (long)(pAVar5->DeathSound).super_FSoundID.ID;
    goto LAB_004e1089;
  case 9:
    lVar4 = (long)(pAVar5->ActiveSound).super_FSoundID.ID;
LAB_004e1089:
    if (lVar4 == 0) {
      str = (char *)0x0;
    }
    else {
      str = S_sfx.Array[lVar4].name.Chars;
    }
LAB_004e119c:
    iVar3 = ACSStringPool::AddString(&GlobalACSStrings,str);
    return iVar3;
  case 10:
    uVar6 = (pAVar5->flags).Value >> 5;
    goto LAB_004e1121;
  case 0xb:
    uVar6 = (pAVar5->flags2).Value;
    goto LAB_004e0eab;
  case 0xc:
    bVar2 = DObject::IsKindOf((DObject *)pAVar5,APlayerPawn::RegistrationInfo.MyClass);
    if (!bVar2) {
      return 0;
    }
    ppAVar7 = *(AActor ***)&pAVar5[1].super_DThinker.super_DObject.ObjectFlags;
    break;
  case 0xd:
    uVar6 = (pAVar5->flags5).Value >> 7;
    goto LAB_004e1121;
  case 0xe:
    uVar6 = (pAVar5->flags4).Value >> 0x1e;
    goto LAB_004e1121;
  case 0xf:
    ppAVar7 = (AActor **)pAVar5->Gravity;
    break;
  case 0x10:
    uVar6 = (pAVar5->flags).Value;
LAB_004e0eab:
    uVar6 = uVar6 >> 0x1b;
    goto LAB_004e1121;
  case 0x11:
    bVar2 = DObject::IsKindOf((DObject *)pAVar5,APlayerPawn::RegistrationInfo.MyClass);
    if (bVar2) {
      return *(int *)&pAVar5[1].super_DThinker.super_DObject._vptr_DObject;
    }
    iVar3 = AActor::SpawnHealth(pAVar5);
    return iVar3;
  case 0x12:
    uVar6 = (pAVar5->flags).Value >> 0x11;
    goto LAB_004e1121;
  case 0x13:
    uVar6 = (pAVar5->flags3).Value >> 0x12;
    goto LAB_004e1121;
  case 0x14:
    (*(pAVar5->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_14,pAVar5);
    iVar3 = ACSStringPool::AddString(&GlobalACSStrings,FName::NameData.NameArray[local_14].Text);
    return iVar3;
  case 0x15:
    str = AActor::GetTag(pAVar5,(char *)0x0);
    goto LAB_004e119c;
  case 0x16:
    return pAVar5->Score;
  case 0x17:
    uVar6 = (pAVar5->flags6).Value >> 0x10;
    goto LAB_004e1121;
  case 0x18:
    ppAVar7 = (AActor **)pAVar5->DamageFactor;
    break;
  case 0x19:
    iVar3 = DoGetMasterTID(pAVar5);
    return iVar3;
  case 0x1a:
    pAVar1 = (pAVar5->target).field_0.p;
    if (pAVar1 == (AActor *)0x0) {
      return 0;
    }
    if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (pAVar5->target).field_0.p = (AActor *)0x0;
      return 0;
    }
    pAVar5 = (pAVar5->target).field_0.p;
    goto LAB_004e1173;
  case 0x1b:
    pAVar1 = (pAVar5->tracer).field_0.p;
    if (pAVar1 == (AActor *)0x0) {
      return 0;
    }
    if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (pAVar5->tracer).field_0.p = (AActor *)0x0;
      return 0;
    }
    pAVar5 = (pAVar5->tracer).field_0.p;
LAB_004e1173:
    return pAVar5->tid;
  case 0x1c:
    return pAVar5->waterlevel;
  case 0x1d:
    ppAVar7 = (AActor **)(pAVar5->Scale).X;
    break;
  case 0x1e:
    ppAVar7 = (AActor **)(pAVar5->Scale).Y;
    break;
  case 0x1f:
    uVar6 = (pAVar5->flags2).Value >> 0x1c;
LAB_004e1121:
    return uVar6 & 1;
  case 0x20:
    return pAVar5->Mass;
  case 0x21:
    return pAVar5->accuracy;
  case 0x22:
    return pAVar5->stamina;
  case 0x23:
    ppAVar7 = (AActor **)pAVar5->Height;
    break;
  case 0x24:
    ppAVar7 = (AActor **)pAVar5->radius;
    break;
  case 0x25:
    return pAVar5->reactiontime;
  case 0x26:
    ppAVar7 = (AActor **)pAVar5->meleerange;
    break;
  case 0x27:
    bVar2 = DObject::IsKindOf((DObject *)pAVar5,APlayerPawn::RegistrationInfo.MyClass);
    if (!bVar2) {
      return 0;
    }
    ppAVar7 = pAVar5[1].sprev;
    break;
  case 0x28:
    bVar2 = DObject::IsKindOf((DObject *)pAVar5,APlayerPawn::RegistrationInfo.MyClass);
    if (!bVar2) {
      return 0;
    }
    ppAVar7 = (AActor **)pAVar5[1].SpriteAngle.Degrees;
    break;
  case 0x29:
    return pAVar5->fillcolor;
  case 0x2a:
    ppAVar7 = (AActor **)pAVar5->Friction;
    break;
  case 0x2b:
    ppAVar7 = (AActor **)pAVar5->DamageMultiply;
    break;
  case 0x2c:
    ppAVar7 = (AActor **)pAVar5->MaxStepHeight;
    break;
  case 0x2d:
    ppAVar7 = (AActor **)pAVar5->MaxDropOffHeight;
    break;
  case 0x2e:
    str = FName::NameData.NameArray[(pAVar5->DamageType).super_FName.Index].Text;
    goto LAB_004e119c;
  default:
    goto switchD_004e0dfc_default;
  }
  iVar3 = SUB84((double)ppAVar7 + 103079215104.0,0);
switchD_004e0dfc_default:
  return iVar3;
}

Assistant:

FACSStack::FACSStack()
{
	sp = 0;
	next = head;
	prev = NULL;
	head = this;
}